

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O1

void forget_objects(int percent)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  int count;
  long lVar5;
  ulong uVar6;
  int indices [538];
  int local_888 [540];
  
  if (percent != 0) {
    if (percent - 0x65U < 0xffffff9c) {
      impossible("forget_objects: bad percent %d",percent);
      return;
    }
    count = 0;
    iVar2 = 1;
    lVar3 = 0x38;
    do {
      if ((obj_descr[*(short *)((long)objects + lVar3 + -0xe)].oc_descr != (char *)0x0) &&
         (((*(byte *)((long)&objects->oc_name_idx + lVar3) & 1) != 0 ||
          (*(long *)((long)objects + lVar3 + -8) != 0)))) {
        lVar5 = (long)count;
        count = count + 1;
        local_888[lVar5] = iVar2;
      }
      iVar2 = iVar2 + 1;
      lVar3 = lVar3 + 0x28;
    } while (lVar3 != 0x5420);
    randomize(local_888,count);
    if (0x31 < percent * count) {
      uVar1 = (percent * count + 0x32U) / 100;
      uVar4 = 1;
      if (1 < uVar1) {
        uVar4 = (ulong)uVar1;
      }
      uVar6 = 0;
      do {
        forget_single_object(local_888[uVar6]);
        uVar6 = uVar6 + 1;
      } while (uVar4 != uVar6);
    }
  }
  return;
}

Assistant:

void forget_objects(int percent)
{
	int i, count;
	int indices[NUM_OBJECTS];

	if (percent == 0) return;
	if (percent <= 0 || percent > 100) {
	    impossible("forget_objects: bad percent %d", percent);
	    return;
	}

	for (count = 0, i = 1; i < NUM_OBJECTS; i++)
	    if (OBJ_DESCR(objects[i]) &&
		    (objects[i].oc_name_known || objects[i].oc_uname))
		indices[count++] = i;

	randomize(indices, count);

	/* forget first % of randomized indices */
	count = ((count * percent) + 50) / 100;
	for (i = 0; i < count; i++)
	    forget_single_object(indices[i]);
}